

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O2

void __thiscall ftxui::ScreenInteractive::Draw(ScreenInteractive *this,Component *component)

{
  string *psVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  Cursor CVar5;
  bool bVar6;
  bool bVar7;
  Dimensions DVar8;
  ostream *poVar9;
  int iVar10;
  int iVar11;
  allocator_type local_a9;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string *local_48;
  Element document;
  
  (*((component->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_ComponentBase[2])(&document);
  switch(this->dimension_) {
  case FitComponent:
    DVar8 = Terminal::Size();
    (*(document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node[2])
              ();
    iVar10 = ((document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_x;
    if (DVar8.dimx <= iVar10) {
      iVar10 = DVar8.dimx;
    }
    iVar4 = ((document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            requirement_).min_y;
    iVar11 = DVar8.dimy;
    if (iVar4 < DVar8.dimy) {
      iVar11 = iVar4;
    }
    break;
  case Fixed:
    iVar10 = (this->super_Screen).dimx_;
    iVar11 = (this->super_Screen).dimy_;
    break;
  case Fullscreen:
    DVar8 = Terminal::Size();
    iVar10 = DVar8.dimx;
    DVar8 = Terminal::Size();
    iVar11 = DVar8.dimy;
    break;
  case TerminalOutput:
    (*(document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Node[2])
              ();
    DVar8 = Terminal::Size();
    iVar10 = DVar8.dimx;
    iVar11 = ((document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             requirement_).min_y;
    break;
  default:
    iVar10 = 0;
    iVar11 = 0;
  }
  bVar6 = (this->super_Screen).dimy_ != iVar11;
  bVar7 = (this->super_Screen).dimx_ != iVar10;
  local_48 = (string *)&this->reset_cursor_position;
  poVar9 = std::operator<<((ostream *)&std::cout,local_48);
  Screen::ResetPosition_abi_cxx11_(&local_a8,&this->super_Screen,bVar6 || bVar7);
  std::operator<<(poVar9,(string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (bVar6 || bVar7) {
    (this->super_Screen).dimx_ = iVar10;
    (this->super_Screen).dimy_ = iVar11;
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
              ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)&local_88,(long)iVar10,
               (allocator_type *)&local_68);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
              *)&local_a8,(long)iVar11,(value_type *)&local_88,&local_a9);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::_M_move_assign(&(this->super_Screen).pixels_,&local_a8);
    std::
    vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
    ::~vector((vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
               *)&local_a8);
    std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector
              ((vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> *)&local_88);
    uVar2 = (this->super_Screen).dimx_;
    uVar3 = (this->super_Screen).dimy_;
    CVar5.y = uVar3 + -1;
    CVar5.x = uVar2 + -1;
    (this->super_Screen).cursor_ = CVar5;
  }
  Draw::i = Draw::i + 1;
  if ((this->use_alternative_screen_ == false) && (Draw::i % 0x14 == 0)) {
    std::__cxx11::to_string(&local_88,6);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (anonymous_namespace)::CSI_abi_cxx11_,&local_88);
    std::operator+(&local_68,&local_a8,"n");
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::operator<<((ostream *)&std::cout,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  ftxui::Render(&this->super_Screen,&document);
  psVar1 = &this->set_cursor_position;
  std::__cxx11::string::assign((char *)psVar1);
  std::__cxx11::string::assign((char *)local_48);
  iVar10 = ~(this->super_Screen).cursor_.y + (this->super_Screen).dimy_;
  iVar11 = ~(this->super_Screen).cursor_.x + (this->super_Screen).dimx_;
  if (iVar11 != 0) {
    std::__cxx11::to_string(&local_68,iVar11);
    std::operator+(&local_88,"\x1b[",&local_68);
    std::operator+(&local_a8,&local_88,"D");
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::to_string(&local_68,iVar11);
    std::operator+(&local_88,"\x1b[",&local_68);
    std::operator+(&local_a8,&local_88,"C");
    std::__cxx11::string::append(local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  if (iVar10 != 0) {
    std::__cxx11::to_string(&local_68,iVar10);
    std::operator+(&local_88,"\x1b[",&local_68);
    std::operator+(&local_a8,&local_88,"A");
    std::__cxx11::string::append((string *)psVar1);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::to_string(&local_68,iVar10);
    std::operator+(&local_88,"\x1b[",&local_68);
    std::operator+(&local_a8,&local_88,"B");
    std::__cxx11::string::append(local_48);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&document.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ScreenInteractive::Draw(Component component) {
  auto document = component->Render();
  int dimx = 0;
  int dimy = 0;
  switch (dimension_) {
    case Dimension::Fixed:
      dimx = dimx_;
      dimy = dimy_;
      break;
    case Dimension::TerminalOutput:
      document->ComputeRequirement();
      dimx = Terminal::Size().dimx;
      dimy = document->requirement().min_y;
      break;
    case Dimension::Fullscreen:
      dimx = Terminal::Size().dimx;
      dimy = Terminal::Size().dimy;
      break;
    case Dimension::FitComponent:
      auto terminal = Terminal::Size();
      document->ComputeRequirement();
      dimx = std::min(document->requirement().min_x, terminal.dimx);
      dimy = std::min(document->requirement().min_y, terminal.dimy);
      break;
  }

  bool resized = (dimx != dimx_) || (dimy != dimy_);
  std::cout << reset_cursor_position << ResetPosition(/*clear=*/resized);

  // Resize the screen if needed.
  if (resized) {
    dimx_ = dimx;
    dimy_ = dimy;
    pixels_ = std::vector<std::vector<Pixel>>(dimy, std::vector<Pixel>(dimx));
    cursor_.x = dimx_ - 1;
    cursor_.y = dimy_ - 1;
  }

  // Periodically request the terminal emulator the frame position relative to
  // the screen. This is useful for converting mouse position reported in
  // screen's coordinates to frame's coordinates.
  static constexpr int cursor_refresh_rate =
#if defined(FTXUI_MICROSOFT_TERMINAL_FALLBACK)
      // Microsoft's terminal suffers from a [bug]. When reporting the cursor
      // position, several output sequences are mixed together into garbage.
      // This causes FTXUI user to see some "1;1;R" sequences into the Input
      // component. See [issue]. Solution is to request cursor position less
      // often. [bug]: https://github.com/microsoft/terminal/pull/7583 [issue]:
      // https://github.com/ArthurSonzogni/FTXUI/issues/136
      150;
#else
      20;
#endif
  static int i = -3;
  ++i;
  if (!use_alternative_screen_ && (i % cursor_refresh_rate == 0))
    std::cout << DeviceStatusReport(DSRMode::kCursor);

  Render(*this, document);

  // Set cursor position for user using tools to insert CJK characters.
  set_cursor_position = "";
  reset_cursor_position = "";

  int dx = dimx_ - 1 - cursor_.x;
  int dy = dimy_ - 1 - cursor_.y;

  if (dx != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dx) + "D";
    reset_cursor_position += "\x1B[" + std::to_string(dx) + "C";
  }
  if (dy != 0) {
    set_cursor_position += "\x1B[" + std::to_string(dy) + "A";
    reset_cursor_position += "\x1B[" + std::to_string(dy) + "B";
  }
}